

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O2

int segdmp_next_feat(uint32 id,vector_t ***out_feat,uint32 *out_n_frame)

{
  uint uVar1;
  FILE *__stream;
  uint32 *puVar2;
  int iVar3;
  int32 iVar4;
  ulong uVar5;
  void *buf;
  long lVar6;
  vector_t **pppfVar7;
  char *fmt;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint32 uVar11;
  
  uVar9 = nxt_seg[id];
  if (uVar9 == n_seg[id]) {
    nxt_seg[id] = 0;
    iVar3 = 0;
  }
  else {
    __stream = (FILE *)dmp_fp[id_part[id]];
    nxt_seg[id] = uVar9 + 1;
    uVar1 = id_nxt_off[id];
    uVar5 = ftell(__stream);
    if (uVar5 != uVar1) {
      iVar3 = fseek(__stream,(ulong)uVar1,0);
      if (iVar3 < 0) {
        fmt = "Unable to seek to position in dmp file";
        lVar6 = 0x2d6;
        goto LAB_0010715c;
      }
    }
    if (n_frame == (uint32 **)0x0) {
      uVar11 = 1;
    }
    else {
      uVar11 = n_frame[id][uVar9];
    }
    buf = __ckd_malloc__((ulong)(frame_sz * uVar11),
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                         ,0x2e1);
    iVar3 = 1;
    iVar4 = bio_fread(buf,1,frame_sz * uVar11,(FILE *)__stream,dmp_swp[id_part[id]],&ignore);
    if (iVar4 != frame_sz * uVar11) {
      fmt = "Unable to read segment from dmp file";
      lVar6 = 0x2e5;
LAB_0010715c:
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                     ,lVar6,fmt);
      exit(1);
    }
    lVar6 = ftell(__stream);
    id_nxt_off[id] = (uint32)lVar6;
    pppfVar7 = (vector_t **)
               __ckd_calloc_2d__((ulong)uVar11,(ulong)n_stream,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                 ,0x2ea);
    puVar2 = vecsize;
    uVar5 = (ulong)n_stream;
    uVar9 = 0;
    for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        pppfVar7[uVar8][uVar10] = (vector_t)((long)buf + (ulong)uVar9 * 4);
        uVar9 = uVar9 + puVar2[uVar10];
      }
    }
    *out_feat = pppfVar7;
    *out_n_frame = uVar11;
  }
  return iVar3;
}

Assistant:

int
segdmp_next_feat(uint32 id,
		 vector_t ***out_feat,
		 uint32 *out_n_frame)
{
    FILE *fp;
    uint32 s;
    uint32 off;
    uint32 n_seg_frame;
    float32 *buf;
    vector_t **feat;
    uint32 i, j, l;
    
    fp = dmp_fp[id_part[id]];

    s = nxt_seg[id];
    if (s == n_seg[id]) {
	nxt_seg[id] = 0;

	return 0;
    }
    else {
	++nxt_seg[id];
    }

    off = id_nxt_off[id];
    if (ftell(fp) != off) {
	if (fseek(fp, off, SEEK_SET) < 0) {
	    E_FATAL_SYSTEM("Unable to seek to position in dmp file");
	}
    }

    if (n_frame == NULL) {
	n_seg_frame = 1;
    }
    else {
	n_seg_frame = n_frame[id][s];
    }

    buf = ckd_malloc(n_seg_frame * frame_sz);

    if (bio_fread(buf, sizeof(char), frame_sz * n_seg_frame,
	       fp, dmp_swp[id_part[id]], &ignore) != frame_sz * n_seg_frame) {
	E_FATAL_SYSTEM("Unable to read segment from dmp file");
    }

    id_nxt_off[id] = ftell(fp);

    feat = (vector_t **)ckd_calloc_2d(n_seg_frame, n_stream, sizeof(vector_t));
    for (i = 0, l = 0; i < n_seg_frame; i++) {
	for (j = 0; j < n_stream; j++) {
	    feat[i][j] = &buf[l];
	    
	    l += vecsize[j];
	}
    }

    *out_feat = feat;
    *out_n_frame = n_seg_frame;

    return 1;
}